

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splitting_filter.c
# Opt level: O3

void WebRtcSpl_AnalysisQMF
               (int16_t *in_data,size_t in_data_length,int16_t *low_band,int16_t *high_band,
               int32_t *filter_state1,int32_t *filter_state2)

{
  ulong uVar1;
  ulong data_length;
  int iVar2;
  int iVar3;
  int32_t filter2 [320];
  int32_t filter1 [320];
  int32_t half_in2 [320];
  int32_t half_in1 [320];
  int32_t local_1428 [320];
  int32_t local_f28 [320];
  int32_t local_a28 [320];
  int32_t local_528 [320];
  
  if ((in_data_length & 1) != 0) {
    __assert_fail("in_data_length % 2 == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/signal_processing/splitting_filter.c"
                  ,0x8b,
                  "void WebRtcSpl_AnalysisQMF(const int16_t *, size_t, int16_t *, int16_t *, int32_t *, int32_t *)"
                 );
  }
  if (in_data_length < 0x282) {
    data_length = in_data_length >> 1;
    if (in_data_length < 2) {
      WebRtcSpl_AllPassQMF(local_528,data_length,local_f28,WebRtcSpl_kAllPassFilter1,filter_state1);
      WebRtcSpl_AllPassQMF(local_a28,data_length,local_1428,WebRtcSpl_kAllPassFilter2,filter_state2)
      ;
    }
    else {
      uVar1 = 0;
      do {
        local_a28[uVar1] = (int)in_data[uVar1 * 2] << 10;
        local_528[uVar1] = (int)in_data[uVar1 * 2 + 1] << 10;
        uVar1 = uVar1 + 1;
      } while (data_length != uVar1);
      WebRtcSpl_AllPassQMF(local_528,data_length,local_f28,WebRtcSpl_kAllPassFilter1,filter_state1);
      WebRtcSpl_AllPassQMF(local_a28,data_length,local_1428,WebRtcSpl_kAllPassFilter2,filter_state2)
      ;
      if (1 < in_data_length) {
        uVar1 = 0;
        do {
          iVar3 = local_f28[uVar1] + local_1428[uVar1] + 0x400 >> 0xb;
          if (iVar3 < -0x7fff) {
            iVar3 = -0x8000;
          }
          if (0x7ffe < iVar3) {
            iVar3 = 0x7fff;
          }
          iVar2 = (local_f28[uVar1] + 0x400) - local_1428[uVar1] >> 0xb;
          if (iVar2 < -0x7fff) {
            iVar2 = -0x8000;
          }
          if (0x7ffe < iVar2) {
            iVar2 = 0x7fff;
          }
          low_band[uVar1] = (int16_t)iVar3;
          high_band[uVar1] = (int16_t)iVar2;
          uVar1 = uVar1 + 1;
        } while (data_length != uVar1);
      }
    }
    return;
  }
  __assert_fail("band_length <= kMaxBandFrameLength",
                "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/signal_processing/splitting_filter.c"
                ,0x8c,
                "void WebRtcSpl_AnalysisQMF(const int16_t *, size_t, int16_t *, int16_t *, int32_t *, int32_t *)"
               );
}

Assistant:

void WebRtcSpl_AnalysisQMF(const int16_t* in_data, size_t in_data_length,
                           int16_t* low_band, int16_t* high_band,
                           int32_t* filter_state1, int32_t* filter_state2)
{
    size_t i;
    int16_t k;
    int32_t tmp;
    int32_t half_in1[kMaxBandFrameLength];
    int32_t half_in2[kMaxBandFrameLength];
    int32_t filter1[kMaxBandFrameLength];
    int32_t filter2[kMaxBandFrameLength];
    const size_t band_length = in_data_length / 2;
    assert(in_data_length % 2 == 0);
    assert(band_length <= kMaxBandFrameLength);

    // Split even and odd samples. Also shift them to Q10.
    for (i = 0, k = 0; i < band_length; i++, k += 2)
    {
        half_in2[i] = WEBRTC_SPL_LSHIFT_W32((int32_t)in_data[k], 10);
        half_in1[i] = WEBRTC_SPL_LSHIFT_W32((int32_t)in_data[k + 1], 10);
    }

    // All pass filter even and odd samples, independently.
    WebRtcSpl_AllPassQMF(half_in1, band_length, filter1,
                         WebRtcSpl_kAllPassFilter1, filter_state1);
    WebRtcSpl_AllPassQMF(half_in2, band_length, filter2,
                         WebRtcSpl_kAllPassFilter2, filter_state2);

    // Take the sum and difference of filtered version of odd and even
    // branches to get upper & lower band.
    for (i = 0; i < band_length; i++)
    {
        tmp = (filter1[i] + filter2[i] + 1024) >> 11;
        low_band[i] = WebRtcSpl_SatW32ToW16(tmp);

        tmp = (filter1[i] - filter2[i] + 1024) >> 11;
        high_band[i] = WebRtcSpl_SatW32ToW16(tmp);
    }
}